

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void tile_worker_hook_init
               (AV1Decoder *pbi,DecWorkerData *thread_data,TileBufferDec *tile_buffer,
               TileDataDec *tile_data,uint8_t allow_update_cdf)

{
  int row;
  int col;
  ThreadData *xd;
  
  xd = thread_data->td;
  row = (tile_data->tile_info).tile_row;
  col = (tile_data->tile_info).tile_col;
  xd->bit_reader = &tile_data->bit_reader;
  memset((CB_BUFFER *)(&xd->dcb + 1),0,0x30000);
  av1_tile_init(&(xd->dcb).xd.tile,&pbi->common,row,col);
  (xd->dcb).xd.current_base_qindex = (pbi->common).quant_params.base_qindex;
  setup_bool_decoder((MACROBLOCKD *)xd,tile_buffer->data,thread_data->data_end,tile_buffer->size,
                     &thread_data->error_info,xd->bit_reader,allow_update_cdf);
  av1_init_macroblockd(&pbi->common,(MACROBLOCKD *)xd);
  (xd->dcb).xd.error_info = &thread_data->error_info;
  av1_init_above_context
            (&(pbi->common).above_contexts,
             (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1,row,(MACROBLOCKD *)xd);
  memcpy(&tile_data->tctx,(pbi->common).fc,0x52fc);
  (xd->dcb).xd.tile_ctx = &tile_data->tctx;
  return;
}

Assistant:

static inline void tile_worker_hook_init(AV1Decoder *const pbi,
                                         DecWorkerData *const thread_data,
                                         const TileBufferDec *const tile_buffer,
                                         TileDataDec *const tile_data,
                                         uint8_t allow_update_cdf) {
  AV1_COMMON *cm = &pbi->common;
  ThreadData *const td = thread_data->td;
  int tile_row = tile_data->tile_info.tile_row;
  int tile_col = tile_data->tile_info.tile_col;

  td->bit_reader = &tile_data->bit_reader;
  av1_zero(td->cb_buffer_base.dqcoeff);

  MACROBLOCKD *const xd = &td->dcb.xd;
  av1_tile_init(&xd->tile, cm, tile_row, tile_col);
  xd->current_base_qindex = cm->quant_params.base_qindex;

  setup_bool_decoder(xd, tile_buffer->data, thread_data->data_end,
                     tile_buffer->size, &thread_data->error_info,
                     td->bit_reader, allow_update_cdf);
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    td->bit_reader->accounting = &pbi->accounting;
    td->bit_reader->accounting->last_tell_frac =
        aom_reader_tell_frac(td->bit_reader);
  } else {
    td->bit_reader->accounting = NULL;
  }
#endif
  av1_init_macroblockd(cm, xd);
  xd->error_info = &thread_data->error_info;
  av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row, xd);

  // Initialise the tile context from the frame context
  tile_data->tctx = *cm->fc;
  xd->tile_ctx = &tile_data->tctx;
#if CONFIG_ACCOUNTING
  if (pbi->acct_enabled) {
    tile_data->bit_reader.accounting->last_tell_frac =
        aom_reader_tell_frac(&tile_data->bit_reader);
  }
#endif
}